

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

void __thiscall
wasm_tabletype_t::wasm_tabletype_t
          (wasm_tabletype_t *this,wasm_valtype_t *type,wasm_limits_t *limits)

{
  uint uVar1;
  uint uVar2;
  ValueType VVar3;
  ExternType *pEVar4;
  
  uVar1 = limits->min;
  uVar2 = limits->max;
  pEVar4 = (ExternType *)operator_new(0x30);
  VVar3 = type->I;
  *(ulong *)&pEVar4[1].kind = (ulong)uVar1;
  pEVar4[2]._vptr_ExternType = (_func_int **)(ulong)uVar2;
  pEVar4->kind = Table;
  pEVar4->_vptr_ExternType = (_func_int **)&PTR__ExternType_0022c8d0;
  *(ValueType *)&pEVar4->field_0xc = VVar3;
  *(undefined2 *)&pEVar4[2].kind = Table;
  *(byte *)((long)&pEVar4[2].kind + 2) = 0;
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = pEVar4;
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_0022cc68;
  (this->elemtype).I = type->I;
  this->limits = *limits;
  fprintf(_stderr,"CAPI: [%s] \n","wasm_valtype_delete");
  operator_delete(type,8);
  return;
}

Assistant:

wasm_tabletype_t(own wasm_valtype_t* type, const wasm_limits_t* limits)
      : wasm_externtype_t{std::make_unique<TableType>(type->I,
                                                      ToWabtLimits(*limits))},
        elemtype(*type),
        limits(*limits) {
    wasm_valtype_delete(type);
  }